

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_seq.c
# Opt level: O1

void jas_matrix_divpow2(jas_matrix_t *matrix,int n)

{
  jas_seqent_t **ppjVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong *puVar8;
  ulong *puVar9;
  
  lVar4 = matrix->numrows_;
  if ((0 < lVar4) && (0 < matrix->numcols_)) {
    ppjVar1 = matrix->rows_;
    if (ppjVar1 == (jas_seqent_t **)0x0) {
      __assert_fail("matrix->rows_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_seq.c"
                    ,0x11b,"void jas_matrix_divpow2(jas_matrix_t *, int)");
    }
    if (lVar4 == 1) {
      lVar5 = 0;
    }
    else {
      lVar5 = (long)ppjVar1[1] - (long)*ppjVar1 >> 3;
    }
    puVar8 = (ulong *)*ppjVar1;
    do {
      if (0 < matrix->numcols_) {
        lVar7 = matrix->numcols_ + 1;
        puVar9 = puVar8;
        do {
          uVar2 = *puVar9;
          uVar6 = -(-uVar2 >> ((byte)n & 0x3f));
          if (-1 < (long)uVar2) {
            uVar6 = uVar2 >> ((byte)n & 0x3f);
          }
          *puVar9 = uVar6;
          puVar9 = puVar9 + 1;
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
      }
      puVar8 = puVar8 + lVar5;
      bVar3 = 1 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

void jas_matrix_divpow2(jas_matrix_t *matrix, int n)
{
	jas_matind_t i;
	jas_matind_t j;
	jas_seqent_t *rowstart;
	jas_matind_t rowstep;
	jas_seqent_t *data;

	if (jas_matrix_numrows(matrix) > 0 && jas_matrix_numcols(matrix) > 0) {
		assert(matrix->rows_);
		rowstep = jas_matrix_rowstep(matrix);
		for (i = matrix->numrows_, rowstart = matrix->rows_[0]; i > 0; --i,
		  rowstart += rowstep) {
			for (j = matrix->numcols_, data = rowstart; j > 0; --j,
			  ++data) {
				*data = (*data >= 0) ? ((*data) >> n) :
				  (-((-(*data)) >> n));
			}
		}
	}
}